

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

char * alcenumString(ALCenum x)

{
  char *pcStack_10;
  ALCenum x_local;
  
  if (x == 0) {
    pcStack_10 = "ALC_NO_ERROR";
  }
  else if (x == 0x310) {
    pcStack_10 = "ALC_CAPTURE_DEVICE_SPECIFIER";
  }
  else if (x == 0x311) {
    pcStack_10 = "ALC_CAPTURE_DEFAULT_DEVICE_SPECIFIER";
  }
  else if (x == 0x312) {
    pcStack_10 = "ALC_CAPTURE_SAMPLES";
  }
  else if (x == 0x313) {
    pcStack_10 = "ALC_CONNECTED";
  }
  else if (x == 0x1000) {
    pcStack_10 = "ALC_MAJOR_VERSION";
  }
  else if (x == 0x1001) {
    pcStack_10 = "ALC_MINOR_VERSION";
  }
  else if (x == 0x1002) {
    pcStack_10 = "ALC_ATTRIBUTES_SIZE";
  }
  else if (x == 0x1003) {
    pcStack_10 = "ALC_ALL_ATTRIBUTES";
  }
  else if (x == 0x1004) {
    pcStack_10 = "ALC_DEFAULT_DEVICE_SPECIFIER";
  }
  else if (x == 0x1005) {
    pcStack_10 = "ALC_DEVICE_SPECIFIER";
  }
  else if (x == 0x1006) {
    pcStack_10 = "ALC_EXTENSIONS";
  }
  else if (x == 0x1007) {
    pcStack_10 = "ALC_FREQUENCY";
  }
  else if (x == 0x1008) {
    pcStack_10 = "ALC_REFRESH";
  }
  else if (x == 0x1009) {
    pcStack_10 = "ALC_SYNC";
  }
  else if (x == 0x1010) {
    pcStack_10 = "ALC_MONO_SOURCES";
  }
  else if (x == 0x1011) {
    pcStack_10 = "ALC_STEREO_SOURCES";
  }
  else if (x == 0x1012) {
    pcStack_10 = "ALC_DEFAULT_ALL_DEVICES_SPECIFIER";
  }
  else if (x == 0x1013) {
    pcStack_10 = "ALC_ALL_DEVICES_SPECIFIER";
  }
  else if (x == 0xa001) {
    pcStack_10 = "ALC_INVALID_DEVICE";
  }
  else if (x == 0xa002) {
    pcStack_10 = "ALC_INVALID_CONTEXT";
  }
  else if (x == 0xa003) {
    pcStack_10 = "ALC_INVALID_ENUM";
  }
  else if (x == 0xa004) {
    pcStack_10 = "ALC_INVALID_VALUE";
  }
  else if (x == 0xa005) {
    pcStack_10 = "ALC_OUT_OF_MEMORY";
  }
  else {
    pcStack_10 = sprintf_alloc("0x%X",(ulong)(uint)x);
  }
  return pcStack_10;
}

Assistant:

const char *alcenumString(const ALCenum x)
{
    switch (x) {
        #define ENUM_TEST(e) case e: return #e
        ENUM_TEST(ALC_FREQUENCY);
        ENUM_TEST(ALC_REFRESH);
        ENUM_TEST(ALC_SYNC);
        ENUM_TEST(ALC_MONO_SOURCES);
        ENUM_TEST(ALC_STEREO_SOURCES);
        ENUM_TEST(ALC_NO_ERROR);
        ENUM_TEST(ALC_INVALID_DEVICE);
        ENUM_TEST(ALC_INVALID_CONTEXT);
        ENUM_TEST(ALC_INVALID_ENUM);
        ENUM_TEST(ALC_INVALID_VALUE);
        ENUM_TEST(ALC_OUT_OF_MEMORY);
        ENUM_TEST(ALC_MAJOR_VERSION);
        ENUM_TEST(ALC_MINOR_VERSION);
        ENUM_TEST(ALC_ATTRIBUTES_SIZE);
        ENUM_TEST(ALC_ALL_ATTRIBUTES);
        ENUM_TEST(ALC_DEFAULT_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_EXTENSIONS);
        ENUM_TEST(ALC_CAPTURE_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_CAPTURE_DEFAULT_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_CAPTURE_SAMPLES);
        ENUM_TEST(ALC_DEFAULT_ALL_DEVICES_SPECIFIER);
        ENUM_TEST(ALC_ALL_DEVICES_SPECIFIER);
        ENUM_TEST(ALC_CONNECTED);
        #undef ENUM_TEST
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}